

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reduce.cpp
# Opt level: O3

void reduce_by_index_sum<tf::RandomPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  int *piVar1;
  code *pcVar2;
  double dVar3;
  long *plVar4;
  pointer puVar5;
  pointer puVar6;
  char extraout_AL;
  bool bVar7;
  int iVar8;
  void *__s;
  ulong uVar9;
  value_type_conflict2 *__val;
  default_delete<tf::Node> *this;
  Executor *this_00;
  long lVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar12;
  in_place_type_t<tf::Node::Runtime> local_34e;
  DefaultTaskParams local_34d;
  int sol;
  int sum;
  DefaultTaskParams local_344 [4];
  Task ptask;
  void *local_338;
  long local_330;
  long local_328;
  Result local_320;
  Expression_lhs<const_int_&> local_300;
  ResultBuilder DOCTEST_RB;
  Task stask;
  shared_ptr<tf::WorkerInterface> local_258;
  IndexRange<unsigned_long> range;
  Taskflow taskflow;
  Executor executor;
  
  local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_258);
  if (local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  taskflow.super_FlowBuilder._graph = &taskflow._graph;
  taskflow._mutex.super___mutex_base._M_mutex.__align = 0;
  taskflow._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  taskflow._name._M_dataplus._M_p = (pointer)&taskflow._name.field_2;
  taskflow._name._M_string_length = 0;
  taskflow._name.field_2._M_local_buf[0] = '\0';
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&taskflow._topologies,0);
  taskflow._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload
  .super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  __s = operator_new(4000);
  lVar10 = 0;
  local_338 = __s;
  local_328 = (long)__s + 4000;
  memset(__s,0,4000);
  local_330 = (long)__s + 4000;
  do {
    iVar8 = rand();
    *(int *)((long)__s + lVar10) = iVar8 % 100 + -0x32;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 4000);
  if (4 < (ulong)(local_330 - (long)local_338)) {
    uVar9 = 1;
    do {
      lVar10 = 0;
      do {
        puVar6 = taskflow._graph.
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar5 = taskflow._graph.
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar8 = *(int *)((long)&DAT_0016ac28 + lVar10);
        this = (default_delete<tf::Node> *)
               taskflow._graph.
               super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               .
               super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        if (taskflow._graph.
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            .
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            taskflow._graph.
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            .
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          do {
            if (*(Node **)this != (Node *)0x0) {
              std::default_delete<tf::Node>::operator()(this,*(Node **)this);
            }
            *(undefined8 *)this = 0;
            this = this + 8;
          } while (this != (default_delete<tf::Node> *)puVar6);
          taskflow._graph.
          super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          .
          super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = puVar5;
        }
        sum = 10;
        sol = 10;
        DOCTEST_RB.super_AssertData._8_8_ = &local_338;
        DOCTEST_RB.super_AssertData.m_file = (char *)&sum;
        local_320.m_passed = false;
        local_320._1_7_ = 0;
        local_300.lhs = (int *)0x0;
        ptask._node = ptask._node & 0xffffffff00000000;
        DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&range;
        stask._node = tf::Graph::
                      _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Static>,reduce_by_index_sum<tf::RandomPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda()_1_>
                                (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,
                                 &tf::ESTATE::NONE,local_344,(void **)&local_320,&local_300.lhs,
                                 (int *)&ptask,(in_place_type_t<tf::Node::Static> *)&local_34d,
                                 (anon_class_24_3_10b1740b *)&DOCTEST_RB);
        ptask._node = (Node *)0x0;
        DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&sol;
        DOCTEST_RB.super_AssertData._28_4_ = 0x3c23d70a;
        DOCTEST_RB.super_AssertData.m_expr._0_4_ = 0x3f000000;
        DOCTEST_RB.super_AssertData._40_8_ = &local_338;
        local_320.m_passed = false;
        local_320._1_7_ = 0;
        local_300.lhs = (int *)0x0;
        local_344[0] = (DefaultTaskParams)0x0;
        local_344[1] = (DefaultTaskParams)0x0;
        local_344[2] = (DefaultTaskParams)0x0;
        local_344[3] = (DefaultTaskParams)0x0;
        DOCTEST_RB.super_AssertData._8_8_ = (TestCaseData *)&range;
        DOCTEST_RB.super_AssertData.m_file = (char *)(long)iVar8;
        ptask._node = tf::Graph::
                      _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Runtime>,tf::make_reduce_by_index_task<std::reference_wrapper<tf::IndexRange<unsigned_long>>,int,reduce_by_index_sum<tf::RandomPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(tf::IndexRange<unsigned_long>,std::optional<int>)_1_,std::plus<int>,tf::RandomPartitioner<tf::DefaultClosureWrapper>>(std::reference_wrapper<tf::IndexRange<unsigned_long>>,int&,reduce_by_index_sum<tf::RandomPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(tf::IndexRange<unsigned_long>,std::optional<int>)_1_,std::plus<int>,tf::RandomPartitioner<tf::DefaultClosureWrapper>)::_lambda(tf::Runtime&)_1_>
                                (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,
                                 &tf::ESTATE::NONE,&local_34d,(void **)&local_320,&local_300.lhs,
                                 (int *)local_344,&local_34e,(anon_class_56_5_4d1302ad *)&DOCTEST_RB
                                );
        tf::Task::precede<tf::Task&>(&stask,&ptask);
        local_320.m_passed = true;
        local_320._1_7_ = 0;
        this_00 = &executor;
        tf::Executor::
        run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
                  ((Future<void> *)&DOCTEST_RB,this_00,&taskflow,
                   (anon_class_8_1_69701ed9 *)&local_320,(anon_class_1_0_00000001 *)&local_300);
        if (DOCTEST_RB.super_AssertData.m_test_case == (TestCaseData *)0x0) {
          std::__throw_future_error(3);
LAB_0013d72e:
          doctest::detail::throwException();
        }
        std::__future_base::_State_baseV2::wait
                  ((_State_baseV2 *)DOCTEST_RB.super_AssertData.m_test_case,this_00);
        plVar4 = (long *)CONCAT44(DOCTEST_RB.super_AssertData._28_4_,
                                  DOCTEST_RB.super_AssertData.m_line);
        if (plVar4 != (long *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            piVar1 = (int *)((long)plVar4 + 0xc);
            iVar8 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
          }
          else {
            iVar8 = *(int *)((long)plVar4 + 0xc);
            *(int *)((long)plVar4 + 0xc) = iVar8 + -1;
          }
          if (iVar8 == 1) {
            (**(code **)(*plVar4 + 0x18))();
          }
        }
        if (DOCTEST_RB.super_AssertData._8_8_ != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     DOCTEST_RB.super_AssertData._8_8_);
        }
        DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
        DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
        DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
        DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
        DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
        DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
        DOCTEST_RB.super_AssertData.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
        ;
        DOCTEST_RB.super_AssertData.m_line = 0x1c3;
        DOCTEST_RB.super_AssertData.m_expr._0_4_ = 0x16dd32;
        DOCTEST_RB.super_AssertData.m_expr._4_4_ = 0;
        DOCTEST_RB.super_AssertData.m_failed = true;
        DOCTEST_RB.super_AssertData.m_threw = false;
        DOCTEST_RB.super_AssertData.m_threw_as = false;
        DOCTEST_RB.super_AssertData.m_exception_type = "";
        DOCTEST_RB.super_AssertData.m_exception_string = "";
        local_300.lhs = &sol;
        local_300.m_at = DT_REQUIRE;
        doctest::detail::Expression_lhs<const_int_&>::operator==<int,_nullptr>
                  (&local_320,&local_300,&sum);
        doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_320.m_decomp);
        DOCTEST_RB.super_AssertData._40_8_ =
             CONCAT71(DOCTEST_RB.super_AssertData._41_7_,local_320.m_passed) ^ 1;
        uVar11 = extraout_XMM0_Da;
        uVar12 = extraout_XMM0_Db;
        if ((local_320.m_decomp.field_0.buf[0x17] < '\0') &&
           (local_320.m_decomp.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(local_320.m_decomp.field_0.data.ptr);
          uVar11 = extraout_XMM0_Da_00;
          uVar12 = extraout_XMM0_Db_00;
        }
        dVar3 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar12,uVar11));
        if (extraout_AL != '\0') {
          pcVar2 = (code *)swi(3);
          (*pcVar2)(SUB84(dVar3,0));
          return;
        }
        if (DOCTEST_RB.super_AssertData.m_failed == true) {
          bVar7 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at);
          if (bVar7) goto LAB_0013d72e;
        }
        if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                             DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
          operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                             DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
        }
        if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                             DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)
           ) {
          operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                             DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0])
                           );
        }
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0x14);
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)(local_330 - (long)local_338 >> 2));
  }
  if (local_338 != (void *)0x0) {
    operator_delete(local_338,local_328 - (long)local_338);
  }
  tf::Taskflow::~Taskflow(&taskflow);
  tf::Executor::~Executor(&executor);
  return;
}

Assistant:

void reduce_by_index_sum(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::vector<int> vec(1000);

  for(auto& i : vec) i = ::rand() % 100 - 50;

  for(size_t n=1; n<vec.size(); n++) {
    for(size_t c : {0, 1, 3, 7, 99}) {
      
      taskflow.clear();

      int sum = 10;
      int sol = 10;
      tf::IndexRange<size_t> range;

      auto stask = taskflow.emplace([&](){
        range.reset(0, vec.size(), 1);
        REQUIRE(range.size() == vec.size());
        for(auto itr = vec.begin(); itr != vec.end(); itr++) {
          sum += *itr;
        }
      });

      tf::Task ptask;

      ptask = taskflow.reduce_by_index(
        std::ref(range),
        sol,
        [&](tf::IndexRange<size_t> subrange, std::optional<int> running_total){
          int lsum = running_total ? *running_total : 0;
          for(size_t i=subrange.begin(); i<subrange.end(); i+=subrange.step_size()) {
            lsum += vec[i];
          }
          return lsum;
        },
        std::plus<int>(), 
        P(c)
      );

      stask.precede(ptask);

      executor.run(taskflow).wait();

      REQUIRE(sol == sum);
    }
  }
}